

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O2

int operator<(bdNodeId *a,bdNodeId *b)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint8_t *b_data;
  uint8_t *a_data;
  
  lVar3 = 0;
  while( true ) {
    if ((int)lVar3 == 0x14) {
      return 0;
    }
    bVar1 = b->data[lVar3];
    bVar2 = a->data[lVar3];
    if (bVar2 < bVar1) break;
    if (bVar2 >= bVar1 && bVar2 != bVar1) {
      return 0;
    }
    lVar3 = lVar3 + 1;
  }
  return 1;
}

Assistant:

int operator<(const bdNodeId &a, const bdNodeId &b) {
#if 0
	std::cerr <<  "operator<(");
	bdPrintNodeId(std::cerr, &a);
	std::cerr <<  ",";
	bdPrintNodeId(std::cerr, &b);
	std::cerr <<  ")" << std::endl;
#endif
	
	uint8_t *a_data = (uint8_t *) a.data;
	uint8_t *b_data = (uint8_t *) b.data;
	for (int i = 0; i < BITDHT_KEY_LEN; i++)
	{
		if (*a_data < *b_data) {
			//fprintf(stderr, "Return 1, at i = %d\n", i);
			return 1;
		}
		else if (*a_data > *b_data) {
			//fprintf(stderr, "Return 0, at i = %d\n", i);
			return 0;
		}
		a_data++;
		b_data++;
	}
	//fprintf(stderr, "Return 0, at i = KEYLEN\n");
	return 0;
}